

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdEncodeSignatureByDer
              (void *handle,char *signature,int sighash_type,bool sighash_anyone_can_pay,
              char **der_signature)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  allocator local_71;
  undefined1 local_70 [32];
  ByteData der_sig;
  SigHashType type;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(signature);
  if (bVar1) {
    local_70._0_8_ = "cfdcapi_key.cpp";
    local_70._8_4_ = 0x389;
    local_70._16_8_ = "CfdEncodeSignatureByDer";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_70,"signature is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_70,"Failed to parameter. signature is null or empty.",
               (allocator *)&der_sig);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_70);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (signature != (char *)0x0) {
    cfd::core::SigHashType::Create(&type,(uint8_t)sighash_type,sighash_anyone_can_pay,false);
    std::__cxx11::string::string((string *)local_70,signature,&local_71);
    cfd::core::CryptoUtil::ConvertSignatureToDer(&der_sig,(string *)local_70,&type);
    std::__cxx11::string::~string((string *)local_70);
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_70,&der_sig);
    pcVar2 = cfd::capi::CreateString((string *)local_70);
    *der_signature = pcVar2;
    std::__cxx11::string::~string((string *)local_70);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&der_sig);
    return 0;
  }
  local_70._0_8_ = "cfdcapi_key.cpp";
  local_70._8_4_ = 0x38f;
  local_70._16_8_ = "CfdEncodeSignatureByDer";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_70,"der_signature is null.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_70,"Failed to parameter. der_signature is null.",(allocator *)&der_sig)
  ;
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_70);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdEncodeSignatureByDer(
    void* handle, const char* signature, int sighash_type,
    bool sighash_anyone_can_pay, char** der_signature) {
  try {
    cfd::Initialize();
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (signature == nullptr) {
      warn(CFD_LOG_SOURCE, "der_signature is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. der_signature is null.");
    }

    SigHashType type = SigHashType::Create(
        static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
    ByteData der_sig = CryptoUtil::ConvertSignatureToDer(signature, type);
    *der_signature = CreateString(der_sig.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}